

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O3

bool __thiscall QPainterPath::intersects(QPainterPath *this,QRectF *rect)

{
  double dVar1;
  Element *pEVar2;
  double dVar3;
  double dVar4;
  char cVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  QPainterPathPrivate *d;
  QPainterPathPrivate *pQVar10;
  long in_FS_OFFSET;
  double dVar11;
  double dVar12;
  QPointF local_68;
  double local_58;
  double dStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar10 = (this->d_ptr).d.ptr;
  if ((pQVar10 != (QPainterPathPrivate *)0x0) && ((int)(pQVar10->elements).d.size == 1)) {
    pEVar2 = (pQVar10->elements).d.ptr;
    local_58 = pEVar2->x;
    dStack_50 = pEVar2->y;
    cVar5 = QRectF::contains((QPointF *)rect);
    bVar6 = true;
    if (cVar5 != '\0') goto LAB_003e2c1a;
    pQVar10 = (this->d_ptr).d.ptr;
  }
  if ((pQVar10 != (QPainterPathPrivate *)0x0) &&
     (((pQVar10->elements).d.size != 1 || (((pQVar10->elements).d.ptr)->type != MoveToElement)))) {
    if ((pQVar10->field_0x84 & 4) != 0) {
      computeControlPointRect(this);
    }
    dVar11 = (pQVar10->controlBounds).xp;
    dVar1 = (pQVar10->controlBounds).yp;
    dVar12 = (pQVar10->controlBounds).h;
    dVar3 = (pQVar10->controlBounds).w + dVar11;
    local_48 = 0xffffffff;
    uStack_44 = 0xffffffff;
    uStack_40 = 0xffffffff;
    uStack_3c = 0xffffffff;
    local_58 = -NAN;
    dStack_50 = -NAN;
    QRectF::normalized();
    if (dVar11 <= local_58) {
      dVar11 = local_58;
    }
    dVar4 = local_58 + (double)CONCAT44(uStack_44,local_48);
    if (dVar3 <= dVar4) {
      dVar4 = dVar3;
    }
    if (dVar11 <= dVar4) {
      dVar11 = dVar1;
      if (dVar1 <= dStack_50) {
        dVar11 = dStack_50;
      }
      dVar3 = dStack_50 + (double)CONCAT44(uStack_3c,uStack_40);
      dVar12 = dVar12 + dVar1;
      if (dVar12 <= dVar3) {
        dVar3 = dVar12;
      }
      if (dVar11 <= dVar3) {
        bVar6 = qt_painterpath_check_crossing(this,rect);
        if (!bVar6) {
          dVar11 = rect->h * 0.5 + rect->yp;
          local_68.yp._0_4_ = SUB84(dVar11,0);
          local_68.xp = rect->w * 0.5 + rect->xp;
          local_68.yp._4_4_ = (int)((ulong)dVar11 >> 0x20);
          bVar6 = contains(this,&local_68);
          if (!bVar6) {
            pQVar10 = (this->d_ptr).d.ptr;
            uVar7 = (pQVar10->elements).d.size;
            if (uVar7 != 0) {
              lVar8 = 0x10;
              uVar9 = 0;
              do {
                pEVar2 = (pQVar10->elements).d.ptr;
                if (*(int *)((long)&pEVar2->x + lVar8) == 0) {
                  local_68 = *(QPointF *)((long)pEVar2 + lVar8 + -0x10);
                  cVar5 = QRectF::contains((QPointF *)rect);
                  if (cVar5 != '\0') goto LAB_003e2c75;
                  uVar7 = (pQVar10->elements).d.size;
                }
                uVar9 = uVar9 + 1;
                lVar8 = lVar8 + 0x18;
                bVar6 = false;
              } while (uVar9 < uVar7);
              goto LAB_003e2c1a;
            }
            goto LAB_003e2c18;
          }
        }
LAB_003e2c75:
        bVar6 = true;
        goto LAB_003e2c1a;
      }
    }
  }
LAB_003e2c18:
  bVar6 = false;
LAB_003e2c1a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool QPainterPath::intersects(const QRectF &rect) const
{
    if (elementCount() == 1 && rect.contains(elementAt(0)))
        return true;

    if (isEmpty())
        return false;

    QRectF cp = controlPointRect();
    QRectF rn = rect.normalized();

    // QRectF::intersects returns false if one of the rects is a null rect
    // which would happen for a painter path consisting of a vertical or
    // horizontal line
    if (qMax(rn.left(), cp.left()) > qMin(rn.right(), cp.right())
        || qMax(rn.top(), cp.top()) > qMin(rn.bottom(), cp.bottom()))
        return false;

    // If any path element cross the rect its bound to be an intersection
    if (qt_painterpath_check_crossing(this, rect))
        return true;

    if (contains(rect.center()))
        return true;

    Q_D(QPainterPath);

    // Check if the rectangle surrounds any subpath...
    for (int i=0; i<d->elements.size(); ++i) {
        const Element &e = d->elements.at(i);
        if (e.type == QPainterPath::MoveToElement && rect.contains(e))
            return true;
    }

    return false;
}